

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O1

void __thiscall
MuxerManager::checkTrackList(MuxerManager *this,vector<StreamInfo,_std::allocator<StreamInfo>_> *ci)

{
  pointer pSVar1;
  size_t __n;
  byte bVar2;
  byte bVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  StreamInfo *si;
  pointer pSVar11;
  bool bVar12;
  char *pcVar13;
  ostringstream ss;
  uint *local_1f8;
  undefined8 local_1f0;
  uint local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  MuxerManager *local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  pointer local_1b8;
  size_t local_1b0;
  ostringstream local_1a8 [376];
  
  sVar6 = ::aacCodecInfo.programName._M_string_length;
  sVar5 = ::h264DepCodecInfo.programName._M_string_length;
  sVar4 = ::h264CodecInfo.programName._M_string_length;
  if (this->m_demuxMode != false) {
    return;
  }
  pSVar11 = (ci->super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (ci->super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar11 == pSVar1) {
    bVar12 = true;
    bVar8 = false;
    bVar7 = false;
  }
  else {
    local_1b8 = ::h264CodecInfo.programName._M_dataplus._M_p;
    local_1c0 = ::h264DepCodecInfo.programName._M_dataplus._M_p;
    local_1c8 = ::aacCodecInfo.programName._M_dataplus._M_p;
    local_1b0 = ::mlpCodecInfo.programName._M_string_length;
    local_1d0 = ::mlpCodecInfo.programName._M_dataplus._M_p;
    bVar3 = 0;
    bVar2 = 0;
    bVar7 = false;
    bVar8 = false;
    local_1d8 = this;
    do {
      __n = (pSVar11->m_codec)._M_string_length;
      if ((__n == sVar4) &&
         ((__n == 0 || (iVar9 = bcmp((pSVar11->m_codec)._M_dataplus._M_p,local_1b8,__n), iVar9 == 0)
          ))) {
        bVar3 = 1;
      }
      else if ((__n == sVar5) &&
              ((__n == 0 ||
               (iVar9 = bcmp((pSVar11->m_codec)._M_dataplus._M_p,local_1c0,__n), iVar9 == 0)))) {
        bVar2 = 1;
      }
      else if ((__n == sVar6) &&
              ((__n == 0 ||
               (iVar9 = bcmp((pSVar11->m_codec)._M_dataplus._M_p,local_1c8,__n), iVar9 == 0)))) {
        bVar8 = true;
      }
      else if (__n == local_1b0) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar9 = bcmp((pSVar11->m_codec)._M_dataplus._M_p,local_1d0,__n);
          if (iVar9 == 0) {
            bVar7 = true;
          }
        }
      }
      pSVar11 = pSVar11 + 1;
    } while (pSVar11 != pSVar1);
    bVar12 = (bool)(bVar3 | bVar2 ^ 1);
    this = local_1d8;
  }
  if (this->m_bluRayMode == false) goto LAB_001c1522;
  if (bVar8) {
    pcVar13 = 
    "Warning! AAC codec is not standard for BD disks, the disk will not play in a Blu-ray player.";
LAB_001c14e4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,0x5c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  else {
    if (bVar7) {
      pcVar13 = 
      "Warning! MLP codec is not standard for BD disks, the disk will not play in a Blu-ray player."
      ;
      goto LAB_001c14e4;
    }
    if ((V3_flags & 0x44U) != 4) goto LAB_001c1522;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Warning! Dolby Vision Double Layer Single Tracks are not standard for BD disks, the disk will not play in a Blu-ray player."
               ,0x7b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  sLastMsg = true;
LAB_001c1522:
  if (bVar12) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "Fatal error: MVC depended view track can\'t be muxed without AVC base view track",0x4f
            );
  puVar10 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar10 = 0x1f8;
  *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
  if (local_1f8 == &local_1e8) {
    puVar10[6] = local_1e8;
    puVar10[7] = uStack_1e4;
    puVar10[8] = uStack_1e0;
    puVar10[9] = uStack_1dc;
  }
  else {
    *(uint **)(puVar10 + 2) = local_1f8;
    *(ulong *)(puVar10 + 6) = CONCAT44(uStack_1e4,local_1e8);
  }
  *(undefined8 *)(puVar10 + 4) = local_1f0;
  local_1e8 = local_1e8 & 0xffffff00;
  __cxa_throw(puVar10,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void MuxerManager::checkTrackList(const vector<StreamInfo>& ci) const
{
    if (m_demuxMode)
        return;

    bool avcFound = false;
    bool mvcFound = false;
    bool aacFound = false;
    bool mlpFound = false;

    for (const StreamInfo& si : ci)
    {
        if (si.m_codec == h264CodecInfo.programName)
            avcFound = true;
        else if (si.m_codec == h264DepCodecInfo.programName)
            mvcFound = true;
        else if (si.m_codec == aacCodecInfo.programName)
            aacFound = true;
        else if (si.m_codec == mlpCodecInfo.programName)
            mlpFound = true;
    }

    if (m_bluRayMode)
    {
        if (aacFound)
            LTRACE(LT_ERROR, 2,
                   "Warning! AAC codec is not standard for BD disks, the disk will not play in a Blu-ray player.");
        else if (m_bluRayMode && mlpFound)
            LTRACE(LT_ERROR, 2,
                   "Warning! MLP codec is not standard for BD disks, the disk will not play in a Blu-ray player.");
        else if (m_bluRayMode && (V3_flags & DV) && !(V3_flags & BL_TRACK))
            LTRACE(LT_ERROR, 2,
                   "Warning! Dolby Vision Double Layer Single Tracks are not standard for BD disks, the disk will "
                   "not play in a Blu-ray player.");
    }
    if (!avcFound && mvcFound)
        THROW(ERR_INVALID_STREAMS_SELECTED,
              "Fatal error: MVC depended view track can't be muxed without AVC base view track")
}